

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

Result_Type * __thiscall
chaiscript::boxed_cast<std::__cxx11::string>
          (Result_Type *__return_storage_ptr__,chaiscript *this,Boxed_Value *bv,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  bad_boxed_cast *this_00;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30 [2];
  
  if (bv != (Boxed_Value *)0x0) {
    local_38 = (undefined1  [8])&std::__cxx11::string::typeinfo;
    local_30[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&std::__cxx11::string::typeinfo;
    local_30[1]._M_pi._0_4_ = 0;
    bVar1 = Type_Info::bare_equal(*(Type_Info **)this,(Type_Info *)local_38);
    if ((!bVar1) &&
       (bVar1 = Type_Conversions::convertable_type<std::__cxx11::string>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), bVar1)) {
      bVar1 = Type_Conversions::convertable_type<std::__cxx11::string>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (bVar1) {
        Type_Conversions::boxed_type_conversion<std::__cxx11::string>
                  ((Type_Conversions *)local_38,
                   (Conversion_Saves *)
                   (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(Boxed_Value *)
                          (bv->m_data).
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
        detail::
        Cast_Helper_Inner<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::cast(__return_storage_ptr__,(Boxed_Value *)local_38,(Type_Conversions_State *)bv);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_30);
        return __return_storage_ptr__;
      }
      this_00 = (bad_boxed_cast *)__cxa_allocate_exception(0x48);
      exception::bad_boxed_cast::bad_boxed_cast
                (this_00,**(Type_Info **)this,(type_info *)&std::__cxx11::string::typeinfo);
      __cxa_throw(this_00,&exception::bad_boxed_cast::typeinfo,
                  exception::bad_boxed_cast::~bad_boxed_cast);
    }
  }
  detail::
  Cast_Helper_Inner<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cast(__return_storage_ptr__,(Boxed_Value *)this,(Type_Conversions_State *)bv);
  return __return_storage_ptr__;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }